

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.h
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
CEObserver::Time(vector<double,_std::allocator<double>_> *__return_storage_ptr__,CEObserver *this,
                CEDate *date)

{
  double __x;
  double dVar1;
  double local_28;
  double local_20;
  
  (*date->_vptr_CEDate[5])(date);
  dVar1 = floor(__x);
  local_20 = this->utc_offset_ / 24.0 + (__x - dVar1);
  dVar1 = CppEphem::sec_per_day();
  local_20 = dVar1 * local_20;
  local_28 = CETime::TimeSec2Time(&local_20);
  CETime::TimeDbl2Vect(__return_storage_ptr__,&local_28);
  return __return_storage_ptr__;
}

Assistant:

inline
std::vector<double> CEObserver::Time(const CEDate& date)
{
    double utc = date.MJD();
    utc -= std::floor(utc);
    utc += utc_offset_/24.0;            // Do this here for precision reasons
    utc *= CppEphem::sec_per_day();
    return CETime::TimeDbl2Vect( CETime::TimeSec2Time(utc) ) ;
}